

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O0

pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
* __thiscall
libtorrent::aux::split_string
          (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
           *__return_storage_ptr__,aux *this,string_view last,char sep)

{
  basic_string_view<char,_std::char_traits<char>_> local_58;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  size_type local_28;
  size_type pos;
  undefined1 auStack_18 [7];
  char sep_local;
  string_view last_local;
  
  last_local._M_len = last._M_len;
  pos._7_1_ = (char)last._M_str;
  _auStack_18 = this;
  local_28 = ::std::basic_string_view<char,_std::char_traits<char>_>::find
                       ((basic_string_view<char,_std::char_traits<char>_> *)auStack_18,pos._7_1_,0);
  if (local_28 == 0xffffffffffffffff) {
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38);
    ::std::
    pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::pair<std::basic_string_view<char,_std::char_traits<char>_>_&,_true>
              ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                *)__return_storage_ptr__,
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_18,&local_38);
  }
  else {
    local_48 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr
                         ((basic_string_view<char,_std::char_traits<char>_> *)auStack_18,0,local_28)
    ;
    local_58 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr
                         ((basic_string_view<char,_std::char_traits<char>_> *)auStack_18,
                          local_28 + 1,0xffffffffffffffff);
    ::std::
    pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::
    pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_true>
              ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                *)__return_storage_ptr__,&local_48,&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<string_view, string_view> split_string(string_view last, char const sep)
	{
		auto const pos = last.find(sep);
		if (pos == string_view::npos) return {last, {}};
		else return {last.substr(0, pos), last.substr(pos + 1)};
	}